

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  ImFont *this;
  char *pcVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  float size;
  ImVec2 IVar3;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar4 [16];
  float fVar5;
  
  if ((int)CONCAT71(in_register_00000011,hide_text_after_double_hash) != 0) {
    pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
    pcVar1 = text;
    if (pcVar2 <= text) {
      size = GImGui->FontSize;
      goto LAB_0015293b;
    }
    do {
      text_end = pcVar1;
      if (*pcVar1 == '#') {
        if (pcVar1[1] == '#') break;
      }
      else if (*pcVar1 == '\0') break;
      pcVar1 = pcVar1 + 1;
      text_end = pcVar2;
    } while (pcVar1 != pcVar2);
  }
  size = GImGui->FontSize;
  if (text_end != text) {
    this = GImGui->Font;
    IVar3 = ImFont::CalcTextSizeA(this,size,3.4028235e+38,wrap_width,text,text_end,(char **)0x0);
    fVar5 = IVar3.x;
    auVar4._4_4_ = IVar3.y;
    auVar4._8_4_ = (undefined4)extraout_XMM0_Qb;
    auVar4._12_4_ = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
    if (0.0 < fVar5) {
      fVar5 = fVar5 - size / this->FontSize;
    }
    auVar4._0_4_ = (float)(int)(fVar5 + 0.95);
    return auVar4._0_8_;
  }
LAB_0015293b:
  return (ImVec2)((ulong)(uint)size << 0x20);
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Cancel out character spacing for the last character of a line (it is baked into glyph->AdvanceX field)
    const float font_scale = font_size / font->FontSize;
    const float character_spacing_x = 1.0f * font_scale;
    if (text_size.x > 0.0f)
        text_size.x -= character_spacing_x;
    text_size.x = (float)(int)(text_size.x + 0.95f);

    return text_size;
}